

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateValidate(z_streamp strm,int check)

{
  internal_state *piVar1;
  int iVar2;
  inflate_state *state;
  int check_local;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if ((check == 0) || (*(int *)&piVar1->pending_buf == 0)) {
      *(uint *)&piVar1->pending_buf = *(uint *)&piVar1->pending_buf & 0xfffffffb;
    }
    else {
      *(uint *)&piVar1->pending_buf = *(uint *)&piVar1->pending_buf | 4;
    }
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateValidate(z_streamp strm, int check) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}